

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_read_prefix(lys_module *module,lys_import *imp,char *value)

{
  int iVar1;
  char *where;
  char **target;
  
  if (imp == (lys_import *)0x0) {
    iVar1 = lyp_check_identifier(module->ctx,value,LY_IDENT_PREFIX,module,(lys_node *)0x0);
    if (iVar1 != 0) {
      free(value);
      return 1;
    }
    target = &module->prefix;
    where = "module";
  }
  else {
    target = &imp->prefix;
    where = "import";
  }
  iVar1 = yang_check_string(module,target,"prefix",where,value,(lys_node *)0x0);
  return iVar1;
}

Assistant:

int
yang_read_prefix(struct lys_module *module, struct lys_import *imp, char *value)
{
    int ret = 0;

    if (!imp && lyp_check_identifier(module->ctx, value, LY_IDENT_PREFIX, module, NULL)) {
        free(value);
        return EXIT_FAILURE;
    }

    if (imp) {
        ret = yang_check_string(module, &imp->prefix, "prefix", "import", value, NULL);
    } else {
        ret = yang_check_string(module, &module->prefix, "prefix", "module", value, NULL);
    }

    return ret;
}